

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O2

void testopaque(wins *wins_ar,int ar_len)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  Am_Image_Array grey2;
  Am_Style opaque_style;
  Am_Style grey_style;
  Am_Image_Array grey;
  Am_Image_Array local_50 [8];
  Am_Style foo;
  Am_Image_Array local_40 [8];
  Am_Image_Array local_38 [8];
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 << 6 != uVar2; uVar2 = uVar2 + 0x40) {
    plVar1 = *(long **)((long)&wins_ar->d3 + uVar2);
    (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&Am_Blue,10,10,0x19,0x19,0);
    (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&Am_Blue,0x1e,0x1e,0x19,0x19,0);
    Am_Image_Array::Am_Image_Array(&grey,0x32);
    Am_Image_Array::Am_Image_Array(local_38,&grey);
    Am_Style::Am_Style((Am_Style *)0x3f800000,0,0,&grey_style,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,
                       local_38);
    Am_Image_Array::~Am_Image_Array(local_38);
    (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&grey_style,10,10,0x19,0x19,0);
    Am_Image_Array::Am_Image_Array(&grey2,10);
    Am_Image_Array::Am_Image_Array(local_40,&grey2);
    Am_Style::Am_Style((Am_Style *)0x3f800000,&opaque_style,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,3,0,
                       local_40);
    Am_Image_Array::~Am_Image_Array(local_40);
    (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&opaque_style,0x1e,0x1e,0x19,0x19,0);
    Am_Image_Array::Am_Image_Array(local_50,&grey2);
    Am_Style::Am_Style((Am_Style *)0x3f800000,&foo,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_50);
    Am_Image_Array::~Am_Image_Array(local_50);
    (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&foo,0x3c,0x3c,0x19,0x19,0);
    Am_Style::~Am_Style(&foo);
    Am_Style::~Am_Style(&opaque_style);
    Am_Image_Array::~Am_Image_Array(&grey2);
    Am_Style::~Am_Style(&grey_style);
    Am_Image_Array::~Am_Image_Array(&grey);
  }
  return;
}

Assistant:

void
testopaque(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d3;

    d->Draw_Rectangle(Am_White, Am_Blue, 10, 10, 25, 25);

    d->Draw_Rectangle(Am_White, Am_Blue, 30, 30, 25, 25);

    Am_Image_Array grey(50);
    Am_Style grey_style(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                        Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                        Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                        Am_FILL_POLY_EVEN_ODD, grey);
    d->Draw_Rectangle(Am_White, grey_style, 10, 10, 25, 25);

    Am_Image_Array grey2(10);
    Am_Style opaque_style(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                          Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                          Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_OPAQUE_STIPPLED,
                          Am_FILL_POLY_EVEN_ODD, grey2);
    d->Draw_Rectangle(Am_White, opaque_style, 30, 30, 25, 25);

    Am_Style foo(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                 Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                 Am_FILL_POLY_EVEN_ODD, grey2);

    d->Draw_Rectangle(Am_White, foo, 60, 60, 25, 25);
  }
}